

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

optional<CService> * GetLocalAddrForPeer(optional<CService> *__return_storage_ptr__,CNode *node)

{
  long lVar1;
  bool bVar2;
  iterator iVar3;
  uint64_t uVar4;
  int bits;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  NodeId local_108;
  FastRandomContext rng;
  CService addrLocal;
  CService addrLocal_1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  GetLocalAddress(&addrLocal,node);
  FastRandomContext::FastRandomContext(&rng,false);
  CNode::GetAddrLocal(&addrLocal_1,node);
  if (((fDiscover == true) && (bVar2 = CNetAddr::IsRoutable((CNetAddr *)&node->addr), bVar2)) &&
     (bVar2 = CNetAddr::IsRoutable(&addrLocal_1.super_CNetAddr), bVar2)) {
    bVar2 = ReachableNets::Contains(&g_reachable_nets,&addrLocal_1.super_CNetAddr);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addrLocal_1);
    if (!bVar2) goto LAB_00707c50;
    bVar2 = CNetAddr::IsRoutable(&addrLocal.super_CNetAddr);
    if (bVar2) {
      UniqueLock<GlobalMutex>::UniqueLock
                ((UniqueLock<GlobalMutex> *)&addrLocal_1,&g_maplocalhost_mutex,
                 "g_maplocalhost_mutex",
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
                 ,0xe0,false);
      iVar3 = std::
              _Rb_tree<CNetAddr,_std::pair<const_CNetAddr,_LocalServiceInfo>,_std::_Select1st<std::pair<const_CNetAddr,_LocalServiceInfo>_>,_std::less<CNetAddr>,_std::allocator<std::pair<const_CNetAddr,_LocalServiceInfo>_>_>
              ::find(&mapLocalHost._M_t,&addrLocal.super_CNetAddr);
      if ((_Rb_tree_header *)iVar3._M_node == &mapLocalHost._M_t._M_impl.super__Rb_tree_header) {
        bits = 1;
      }
      else {
        bits = (uint)(4 < (int)iVar3._M_node[2]._M_color) * 2 + 1;
      }
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&addrLocal_1);
      uVar4 = RandomMixin<FastRandomContext>::randbits
                        (&rng.super_RandomMixin<FastRandomContext>,bits);
      if (uVar4 != 0) goto LAB_00707c50;
    }
    if (node->m_conn_type == INBOUND) {
      CNode::GetAddrLocal(&addrLocal_1,node);
      CService::operator=(&addrLocal,&addrLocal_1);
    }
    else {
      CNode::GetAddrLocal(&addrLocal_1,node);
      CNetAddr::SetIP(&addrLocal.super_CNetAddr,&addrLocal_1.super_CNetAddr);
    }
  }
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addrLocal_1);
LAB_00707c50:
  bVar2 = CNetAddr::IsRoutable(&addrLocal.super_CNetAddr);
  if (bVar2) {
    bVar2 = LogAcceptCategory(NET,Debug);
    if (bVar2) {
      CService::ToStringAddrPort_abi_cxx11_((string *)&addrLocal_1,&addrLocal);
      local_108 = node->id;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
      ;
      source_file._M_len = 0x57;
      logging_function._M_str = "GetLocalAddrForPeer";
      logging_function._M_len = 0x13;
      LogPrintFormatInternal<std::__cxx11::string,long>
                (logging_function,source_file,0x104,NET,Debug,(ConstevalFormatString<2U>)0xc983fd,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addrLocal_1,
                 &local_108);
      std::__cxx11::string::~string((string *)&addrLocal_1);
    }
    std::optional<CService>::optional<CService,_true>(__return_storage_ptr__,&addrLocal);
  }
  else {
    (__return_storage_ptr__->super__Optional_base<CService,_false,_false>)._M_payload.
    super__Optional_payload<CService,_true,_false,_false>.super__Optional_payload_base<CService>.
    _M_engaged = false;
  }
  ChaCha20::~ChaCha20(&rng.rng);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addrLocal);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<CService> GetLocalAddrForPeer(CNode& node)
{
    CService addrLocal{GetLocalAddress(node)};
    // If discovery is enabled, sometimes give our peer the address it
    // tells us that it sees us as in case it has a better idea of our
    // address than we do.
    FastRandomContext rng;
    if (IsPeerAddrLocalGood(&node) && (!addrLocal.IsRoutable() ||
         rng.randbits((GetnScore(addrLocal) > LOCAL_MANUAL) ? 3 : 1) == 0))
    {
        if (node.IsInboundConn()) {
            // For inbound connections, assume both the address and the port
            // as seen from the peer.
            addrLocal = CService{node.GetAddrLocal()};
        } else {
            // For outbound connections, assume just the address as seen from
            // the peer and leave the port in `addrLocal` as returned by
            // `GetLocalAddress()` above. The peer has no way to observe our
            // listening port when we have initiated the connection.
            addrLocal.SetIP(node.GetAddrLocal());
        }
    }
    if (addrLocal.IsRoutable()) {
        LogDebug(BCLog::NET, "Advertising address %s to peer=%d\n", addrLocal.ToStringAddrPort(), node.GetId());
        return addrLocal;
    }
    // Address is unroutable. Don't advertise.
    return std::nullopt;
}